

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O1

bool __thiscall QGles2ShaderResourceBindings::create(QGles2ShaderResourceBindings *this)

{
  QRhiImplementation *this_00;
  void *pvVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  long in_FS_OFFSET;
  QRhiResource *copy;
  bool local_29;
  QGles2ShaderResourceBindings *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QRhiShaderResourceBindings).super_QRhiResource.m_rhi;
  bVar2 = QRhiImplementation::sanityCheckShaderResourceBindings
                    (this_00,&this->super_QRhiShaderResourceBindings);
  if (bVar2) {
    this->hasDynamicOffset = false;
    uVar3 = (ulong)(uint)(this->super_QRhiShaderResourceBindings).m_bindings.
                         super_QVLABase<QRhiShaderResourceBinding>.super_QVLABaseBase.s;
    if (uVar3 != 0) {
      pvVar1 = (this->super_QRhiShaderResourceBindings).m_bindings.
               super_QVLABase<QRhiShaderResourceBinding>.super_QVLABaseBase.ptr;
      lVar4 = 0;
      do {
        if ((*(int *)((long)pvVar1 + lVar4 + 8) == 0) &&
           (*(char *)((long)pvVar1 + lVar4 + 0x20) == '\x01')) {
          this->hasDynamicOffset = true;
          break;
        }
        lVar4 = lVar4 + 0x118;
      } while (uVar3 * 0x118 - lVar4 != 0);
    }
    QRhiImplementation::updateLayoutDesc(this_00,&this->super_QRhiShaderResourceBindings);
    this->generation = this->generation + 1;
    local_29 = false;
    local_28 = this;
    QHash<QRhiResource*,bool>::emplace<bool_const&>
              ((QHash<QRhiResource*,bool> *)&this_00->resources,(QRhiResource **)&local_28,&local_29
              );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QGles2ShaderResourceBindings::create()
{
    QRHI_RES_RHI(QRhiGles2);
    if (!rhiD->sanityCheckShaderResourceBindings(this))
        return false;

    hasDynamicOffset = false;
    for (int i = 0, ie = m_bindings.size(); i != ie; ++i) {
        const QRhiShaderResourceBinding::Data *b = QRhiImplementation::shaderResourceBindingData(m_bindings.at(i));
        if (b->type == QRhiShaderResourceBinding::UniformBuffer) {
            if (b->u.ubuf.hasDynamicOffset) {
                hasDynamicOffset = true;
                break;
            }
        }
    }

    rhiD->updateLayoutDesc(this);

    generation += 1;
    rhiD->registerResource(this, false);
    return true;
}